

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O1

void __thiscall
soplex::
SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::memPack(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  undefined4 *puVar1;
  uint uVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  int newsize;
  long lVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  DLPSV *pDVar7;
  long lVar8;
  
  pDVar7 = (this->list).
           super_IsList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
           .the_first;
  if (pDVar7 == (DLPSV *)0x0) {
    newsize = 0;
  }
  else {
    newsize = 0;
    do {
      uVar2 = (pDVar7->
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).memused;
      if ((pDVar7->
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_elem ==
          (this->
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ).data + newsize) {
        (pDVar7->
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).memsize = uVar2;
      }
      else {
        if (0 < (int)uVar2) {
          lVar8 = 0;
          do {
            pNVar3 = (pDVar7->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_elem;
            puVar1 = (undefined4 *)
                     ((long)(&(this->
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ).data[newsize].val + 1) + lVar8);
            puVar5 = (undefined4 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar8);
            puVar6 = puVar1 + -0x20;
            for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
              *puVar6 = *puVar5;
              puVar5 = puVar5 + 1;
              puVar6 = puVar6 + 1;
            }
            puVar1[-4] = *(undefined4 *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar8);
            *(undefined1 *)(puVar1 + -3) =
                 *(undefined1 *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar8 + 4U);
            *(undefined8 *)(puVar1 + -2) =
                 *(undefined8 *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar8 + 8U);
            *puVar1 = *(undefined4 *)((long)(&pNVar3->val + 1) + lVar8);
            lVar8 = lVar8 + 0x84;
          } while ((ulong)uVar2 * 0x84 != lVar8);
        }
        (pDVar7->
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_elem = (this->
                   super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ).data + newsize;
        (pDVar7->
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).memsize = uVar2;
        (pDVar7->
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).memused = uVar2;
      }
      if ((this->list).
          super_IsList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
          .the_last == pDVar7) {
        pDVar7 = (DLPSV *)0x0;
      }
      else {
        pDVar7 = pDVar7->thenext;
      }
      newsize = uVar2 + newsize;
    } while (pDVar7 != (DLPSV *)0x0);
  }
  ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::reSize(&this->
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ,newsize);
  this->unusedMem = 0;
  this->numUnusedMemUpdates = 0;
  return;
}

Assistant:

void memPack()
   {
      DLPSV* ps;
      int used;
      int j;

      for(used = 0, ps = list.first(); ps; ps = list.next(ps))
      {
         const int sz = ps->size();

         if(ps->mem() != &this->SVSetBaseArray::operator[](used))
         {
            // cannot use memcpy, because the memory might overlap
            for(j = 0; j < sz; ++j)
               this->SVSetBaseArray::operator[](used + j) = ps->mem()[j];

            ps->setMem(sz, &this->SVSetBaseArray::operator[](used));
            ps->set_size(sz);
         }
         else
            ps->set_max(sz);

         used += sz;
      }

#ifdef SOPLEX_DEBUG
      SPxOut::debug(this,
                    "counting unused memory (unusedMem = {}, numUnusedMemUpdates = {}, this = {})\n", unusedMem,
                    numUnusedMemUpdates, (void*)this);
      SPxOut::debug(this,
                    "               --> NEW: unusedMem = {}, zero after memPack() at memMax() = {}\n",
                    memSize() - used, memMax());
#endif
#ifndef NDEBUG
      Nonzero<R>* olddata = SVSetBaseArray::data;
      SVSetBaseArray::reSize(used);
      assert(olddata == SVSetBaseArray::data);
#else
      SVSetBaseArray::reSize(used);
#endif

      unusedMem = 0;
      numUnusedMemUpdates = 0;
   }